

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O3

BinaryenElementSegmentRef
BinaryenAddPassiveElementSegment
          (BinaryenModuleRef module,char *name,char **funcNames,BinaryenIndex numFuncNames)

{
  char *pcVar1;
  HeapType heapType;
  ElementSegment *pEVar2;
  IString *pIVar3;
  Function *pFVar4;
  RefFunc *this;
  Fatal *this_00;
  BinaryenIndex BVar5;
  ulong uVar6;
  string_view sVar7;
  string_view s;
  string_view s_00;
  undefined1 local_1e0 [392];
  ElementSegment *local_58;
  char **local_50;
  MixedArena *local_48;
  BinaryenModuleRef local_40;
  _Head_base<0UL,_wasm::ElementSegment_*,_false> local_38;
  
  BVar5 = numFuncNames;
  local_40 = module;
  pEVar2 = (ElementSegment *)operator_new(0x50);
  (pEVar2->super_Named).name.super_IString.str._M_len = 0;
  (pEVar2->super_Named).name.super_IString.str._M_str = (char *)0x0;
  *(undefined8 *)&(pEVar2->super_Named).hasExplicitName = 0;
  (pEVar2->table).super_IString.str._M_len = 0;
  (pEVar2->table).super_IString.str._M_str = (char *)0x0;
  pEVar2->offset = (Expression *)0x0;
  (pEVar2->type).id = 0x12;
  (pEVar2->data).super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (pEVar2->data).super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (pEVar2->data).super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38._M_head_impl = pEVar2;
  pIVar3 = (IString *)strlen(name);
  sVar7._M_str = (char *)0x0;
  sVar7._M_len = (size_t)name;
  sVar7 = wasm::IString::interned(pIVar3,sVar7,SUB41(BVar5,0));
  (pEVar2->super_Named).name.super_IString.str = sVar7;
  (pEVar2->super_Named).hasExplicitName = true;
  if (numFuncNames != 0) {
    local_48 = &local_40->allocator;
    uVar6 = (ulong)numFuncNames;
    do {
      pcVar1 = *funcNames;
      pIVar3 = (IString *)strlen(pcVar1);
      s._M_str = (char *)0x0;
      s._M_len = (size_t)pcVar1;
      sVar7 = wasm::IString::interned(pIVar3,s,SUB41(BVar5,0));
      pFVar4 = wasm::Module::getFunctionOrNull(local_40,(Name)sVar7);
      if (pFVar4 == (Function *)0x0) {
        wasm::Fatal::Fatal((Fatal *)local_1e0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1e0 + 0x10),"invalid function \'",0x12);
        this_00 = wasm::Fatal::operator<<((Fatal *)local_1e0,funcNames);
        wasm::Fatal::operator<<(this_00,(char (*) [3])"\'.");
        wasm::Fatal::~Fatal((Fatal *)local_1e0);
      }
      local_58 = local_38._M_head_impl;
      pcVar1 = *funcNames;
      local_50 = funcNames;
      pIVar3 = (IString *)strlen(pcVar1);
      s_00._M_str = (char *)0x0;
      s_00._M_len = (size_t)pcVar1;
      sVar7 = wasm::IString::interned(pIVar3,s_00,SUB41(BVar5,0));
      heapType.id = (pFVar4->type).id;
      this = (RefFunc *)MixedArena::allocSpace(local_48,0x20,8);
      (this->super_SpecificExpression<(wasm::Expression::Id)43>).super_Expression._id = RefFuncId;
      (this->super_SpecificExpression<(wasm::Expression::Id)43>).super_Expression.type.id = 0;
      (this->func).super_IString.str = sVar7;
      wasm::RefFunc::finalize(this,heapType);
      local_1e0._0_8_ = this;
      std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
      emplace_back<wasm::Expression*>
                ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)&local_58->data,
                 (Expression **)local_1e0);
      funcNames = local_50 + 1;
      uVar6 = uVar6 - 1;
    } while (uVar6 != 0);
  }
  pEVar2 = wasm::Module::addElementSegment
                     (local_40,(unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                                *)&local_38);
  if (local_38._M_head_impl != (ElementSegment *)0x0) {
    std::default_delete<wasm::ElementSegment>::operator()
              ((default_delete<wasm::ElementSegment> *)&local_38,local_38._M_head_impl);
  }
  return pEVar2;
}

Assistant:

BinaryenElementSegmentRef
BinaryenAddPassiveElementSegment(BinaryenModuleRef module,
                                 const char* name,
                                 const char** funcNames,
                                 BinaryenIndex numFuncNames) {
  auto segment = std::make_unique<ElementSegment>();
  segment->setExplicitName(name);
  for (BinaryenIndex i = 0; i < numFuncNames; i++) {
    auto* func = ((Module*)module)->getFunctionOrNull(funcNames[i]);
    if (func == nullptr) {
      Fatal() << "invalid function '" << funcNames[i] << "'.";
    }
    segment->data.push_back(
      Builder(*(Module*)module).makeRefFunc(funcNames[i], func->type));
  }
  return ((Module*)module)->addElementSegment(std::move(segment));
}